

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pArray;
  mz_uint64 *pmVar1;
  char *user_extra_data_00;
  tdefl_compressor *d;
  size_t sVar2;
  mz_uint16 extra_size;
  mz_bool mVar3;
  mz_uint mVar4;
  uint uVar5;
  tdefl_status tVar6;
  time_t *ptVar8;
  ulong uVar9;
  mz_uint64 *pmVar10;
  size_t sVar11;
  byte bVar12;
  sbyte sVar13;
  ushort uVar14;
  mz_uint64 *pmVar15;
  mz_uint64 *pmVar16;
  long lVar17;
  ulong uVar18;
  mz_uint16 method;
  ulong uVar19;
  sbyte sVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  mz_uint64 mVar23;
  uint uVar24;
  size_t sVar25;
  bool bVar26;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint64 local_128;
  tdefl_compressor *local_120;
  mz_uint64 comp_size;
  mz_uint8 *local_110;
  ulong local_108;
  char *local_100;
  size_t local_f8;
  mz_uint64 local_dir_header_ofs;
  mz_zip_writer_add_state state;
  mz_uint16 local_c0;
  mz_uint16 local_bc;
  time_t cur_time;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined2 uStack_9a;
  undefined6 uStack_98;
  long lStack_92;
  mz_uint8 *local_80;
  int local_74;
  undefined8 local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  mz_uint32 mVar7;
  
  dos_time = 0;
  dos_date = 0;
  local_128 = pZip->m_archive_size;
  comp_size = 0;
  uVar24 = 6;
  if (-1 < (int)level_and_flags) {
    uVar24 = level_and_flags;
  }
  if (uncomp_size == 0) {
    uVar14 = (ushort)((uVar24 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    uVar14 = 8;
  }
  if ((uVar24 >> 0x10 & 1) == 0) {
    uVar14 = uVar14 + 0x800;
  }
  local_120 = (tdefl_compressor *)CONCAT71(local_120._1_7_,(uVar24 & 0x400) != 0);
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_001098e6:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < (uVar24 & 0xf))))) goto LAB_001098e6;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && (uVar24 & 0x400) == 0) goto LAB_001098e6;
  local_100 = pArchive_name;
  local_dir_header_ofs = local_128;
  local_80 = (mz_uint8 *)pBuf;
  local_60 = pComment;
  mVar3 = mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar3 == 0) {
LAB_00109979:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  ptVar8 = last_modified;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar8 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar8,&dos_time,&dos_date);
  local_f8 = strlen(local_100);
  if (0xffff < local_f8) goto LAB_00109979;
  mVar4 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  sVar11 = (pArray->m_central_dir).m_size;
  local_68 = (ulong)comment_size;
  if (0xfffffffe < sVar11 + local_f8 + local_68 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  lVar17 = 0x1c;
  local_108 = CONCAT44(local_108._4_4_,mVar4);
  uVar19 = (ulong)mVar4;
  uVar9 = (ulong)user_extra_data_len;
  if (pArray->m_zip64 == 0) {
    if ((pZip->m_archive_size +
        (ulong)user_extra_data_central_len + local_68 + uVar9 + local_f8 * 2 + uVar19 + sVar11) -
        0xffffff8e < 0xffffffff00000000) {
      pArray->m_zip64 = 1;
    }
    else {
      lVar17 = 0;
    }
  }
  local_70 = 0;
  if ((local_f8 != 0) && (local_100[local_f8 - 1] == '/')) {
    if (uncomp_size != 0 || buf_size != 0) goto LAB_001098e6;
    local_70 = 0x10;
  }
  uVar18 = lVar17 + local_f8 + local_68 + sVar11 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar18) &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar18,1), mVar3 == 0)) ||
     ((uVar18 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar18 &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar18,1),
      mVar3 == 0)))) {
LAB_00109bf8:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  bVar12 = (uVar24 & 0xf) == 0 | (byte)local_120;
  if (buf_size == 0 || bVar12 != 0) {
    local_120 = (tdefl_compressor *)0x0;
  }
  else {
    local_120 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_120 == (tdefl_compressor *)0x0) goto LAB_00109bf8;
  }
  mVar3 = mz_zip_writer_write_zeros(pZip,local_128,(mz_uint32)local_108);
  sVar2 = local_f8;
  if (mVar3 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar19;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                  ,0x17fb,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  local_128 = local_128 + uVar19;
  uStack_98 = 0;
  lStack_92 = 0;
  cur_time = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  uStack_9e = 0;
  uStack_9d = 0;
  uStack_9c = 0;
  uStack_9b = 0;
  uStack_9a = 0;
  bVar26 = (uVar24 & 0x40f) != 0;
  method = (ushort)bVar26 << 3;
  local_108 = (ulong)uVar14;
  uVar21 = (undefined1)((uint)bVar26 << 3);
  if (pArray->m_zip64 != 0) {
    if (local_dir_header_ofs < 0xffffffff && uncomp_size < 0xffffffff) {
      local_110 = (mz_uint8 *)0x0;
      uVar5 = 0;
    }
    else {
      pmVar15 = (mz_uint64 *)0x0;
      pmVar10 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar10 = pmVar15;
      }
      pmVar16 = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar16 = pmVar15;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar15 = &local_dir_header_ofs;
      }
      local_110 = extra_data;
      uVar5 = mz_zip_writer_create_zip64_extra_data(local_110,pmVar10,pmVar16,pmVar15);
    }
    sVar2 = local_f8;
    uVar22 = 0x14;
    if (!bVar26) {
      uVar22 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar22,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)local_108,(uint6)cur_time);
    cur_time = CONCAT17((char)(local_108 >> 8),(undefined7)cur_time);
    uStack_9f = 0;
    uStack_9e = (undefined1)dos_time;
    local_bc = dos_time;
    uStack_9d = (undefined1)(dos_time >> 8);
    local_c0 = dos_date;
    uStack_9c = (undefined1)dos_date;
    uStack_9b = (undefined1)(dos_date >> 8);
    uStack_9a = 0;
    uStack_98 = 0;
    lStack_92 = (ulong)CONCAT13((char)(uVar5 + user_extra_data_len >> 8),
                                CONCAT12((char)(uVar5 + user_extra_data_len),(short)local_f8)) <<
                0x20;
    uStack_a0 = uVar21;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar11 != 0x1e) goto LAB_0010a01b;
    mVar23 = local_128 + 0x1e;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,local_100,sVar2);
    if (sVar11 == sVar2) {
      mVar23 = mVar23 + sVar2;
      if (local_110 == (mz_uint8 *)0x0) {
        local_110 = (mz_uint8 *)0x0;
      }
      else {
        uVar19 = (ulong)uVar5;
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,extra_data,uVar19);
        if (sVar11 != uVar19) goto LAB_0010a01b;
        mVar23 = mVar23 + uVar19;
      }
      goto LAB_00109e50;
    }
LAB_0010a00f:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
LAB_0010a01b:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  if (local_128 >> 0x20 != 0 || comp_size._4_4_ != 0) goto LAB_00109c32;
  uVar22 = 0x14;
  if (!bVar26) {
    uVar22 = 0;
  }
  cur_time._0_5_ = CONCAT14(uVar22,0x4034b50);
  cur_time._0_6_ = (uint6)(uint5)cur_time;
  cur_time._0_7_ = CONCAT16((char)uVar14,(uint6)cur_time);
  cur_time = CONCAT17((char)(uVar14 >> 8),(undefined7)cur_time);
  uStack_9e = (undefined1)dos_time;
  local_bc = dos_time;
  uStack_9d = (undefined1)(dos_time >> 8);
  local_c0 = dos_date;
  uStack_9c = (undefined1)dos_date;
  uStack_9b = (undefined1)(dos_date >> 8);
  uStack_9a = 0;
  uStack_98 = 0;
  lStack_92 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                              CONCAT12((char)user_extra_data_len,(short)local_f8)) << 0x20;
  uStack_a0 = uVar21;
  local_74 = (uint)bVar26 << 3;
  sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
  if (sVar11 != 0x1e) {
LAB_00109eae:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  mVar23 = local_128 + 0x1e;
  sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,local_100,sVar2);
  if (sVar11 != sVar2) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
    goto LAB_00109eae;
  }
  mVar23 = mVar23 + sVar2;
  local_110 = (mz_uint8 *)0x0;
  uVar5 = 0;
  method = (mz_uint16)local_74;
LAB_00109e50:
  extra_size = (mz_uint16)uVar5;
  if (user_extra_data_len != 0) {
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,user_extra_data,uVar9);
    if (sVar11 != uVar9) goto LAB_0010a01b;
    mVar23 = mVar23 + uVar9;
  }
  if ((uVar24 & 0x400) == 0) {
    local_128 = mz_crc32(0,local_80,buf_size);
    uncomp_size = buf_size;
    if ((3 < buf_size & (bVar12 ^ 1)) == 0) goto LAB_00109efa;
    state.m_comp_size = 0;
    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = mVar23;
    mVar4 = tdefl_create_comp_flags_from_zip_params(uVar24 & 0xf,-0xf,0);
    d = local_120;
    tdefl_init(local_120,mz_zip_writer_add_put_buf_callback,&state,mVar4);
    tVar6 = tdefl_compress_buffer(d,local_80,buf_size,TDEFL_FINISH);
    if (tVar6 != TDEFL_STATUS_DONE) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
      pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
      return 0;
    }
    comp_size = state.m_comp_size;
    mVar23 = state.m_cur_archive_file_ofs;
  }
  else {
    local_128 = (mz_uint64)uncomp_crc32;
LAB_00109efa:
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,local_80,buf_size);
    if (sVar11 != buf_size) goto LAB_0010a00f;
    mVar23 = mVar23 + buf_size;
    comp_size = buf_size;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_120);
  if (uncomp_size == 0) {
    uVar9 = 0;
  }
  else {
    if ((local_108 & 8) == 0) {
      __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                    ,0x1873,
                    "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                   );
    }
    state.m_pZip = (mz_zip_archive *)
                   CONCAT17((char)(local_128 >> 0x18),
                            CONCAT16((char)(local_128 >> 0x10),
                                     CONCAT15((char)(local_128 >> 8),
                                              CONCAT14((char)local_128,0x8074b50))));
    uVar21 = (undefined1)uncomp_size;
    if (local_110 == (mz_uint8 *)0x0) {
      if (comp_size >> 0x20 != 0) {
LAB_00109c32:
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      pmVar10 = &state.m_cur_archive_file_ofs;
      pmVar15 = &state.m_cur_archive_file_ofs;
      pmVar16 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size);
      sVar20 = 0x18;
      sVar11 = 0x10;
      sVar13 = 8;
      pmVar1 = &state.m_cur_archive_file_ofs;
      sVar25 = sVar11;
    }
    else {
      pmVar10 = &state.m_comp_size;
      pmVar15 = &state.m_comp_size;
      pmVar16 = &state.m_comp_size;
      state.m_cur_archive_file_ofs = comp_size;
      state.m_comp_size._0_4_ = (undefined4)uncomp_size;
      pmVar1 = &state.m_comp_size;
      uVar21 = (undefined1)(uncomp_size >> 0x20);
      sVar20 = 0x38;
      sVar11 = 0x30;
      sVar13 = 0x28;
      sVar25 = 0x18;
    }
    *(undefined1 *)((long)pmVar1 + 4) = uVar21;
    *(char *)((long)pmVar16 + 5) = (char)(uncomp_size >> sVar13);
    *(char *)((long)pmVar15 + 6) = (char)(uncomp_size >> (sbyte)sVar11);
    *(char *)((long)pmVar10 + 7) = (char)(uncomp_size >> sVar20);
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,&state,sVar25);
    if (sVar11 != sVar25) {
      return 0;
    }
    mVar23 = mVar23 + sVar25;
    uVar9 = uncomp_size;
  }
  user_extra_data_00 = user_extra_data_central;
  if (local_110 != (mz_uint8 *)0x0) {
    pmVar10 = (mz_uint64 *)0x0;
    if (0xfffffffe < uVar9) {
      pmVar10 = &uncomp_size;
    }
    pmVar15 = &comp_size;
    if (uVar9 < 0xffffffff) {
      pmVar15 = (mz_uint64 *)0x0;
    }
    pmVar16 = (mz_uint64 *)0x0;
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar16 = &local_dir_header_ofs;
    }
    mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar10,pmVar15,pmVar16);
    extra_size = (mz_uint16)mVar7;
    uVar9 = uncomp_size;
  }
  mVar3 = mz_zip_writer_add_to_central_dir
                    (pZip,local_100,(mz_uint16)local_f8,local_110,extra_size,local_60,
                     (mz_uint16)local_68,uVar9,comp_size,(mz_uint32)local_128,method,
                     (mz_uint16)local_108,local_bc,local_c0,local_dir_header_ofs,(mz_uint32)local_70
                     ,user_extra_data_00,user_extra_data_central_len);
  if (mVar3 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar23;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size 
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len + 
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
        uncomp_size = buf_size;
        if (uncomp_size <= 3)
        {
            level = 0;
            store_data_uncompressed = MZ_TRUE;
        }
    }

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}